

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O2

bool ComputeIk(IkReal *eetrans,IkReal *eerot,IkReal *pfree,IkSolutionListBase<double> *solutions)

{
  uint uVar1;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double *q_sols_00;
  allocator_type local_26d;
  uint local_26c;
  vector<int,_std::allocator<int>_> vfree;
  vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
  vinfos;
  double T [16];
  double q_sols [48];
  
  uVar4 = 0;
  if (pfree != (IkReal *)0x0) {
    to_mat44(T,eetrans,eerot);
    q_sols_00 = q_sols;
    uVar1 = ur_kinematics::inverse(T,q_sols_00,*pfree);
    std::vector<int,_std::allocator<int>_>::vector(&vfree,0,(allocator_type *)&vinfos);
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    local_26c = uVar1;
    for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
      std::
      vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
      ::vector(&vinfos,6,&local_26d);
      pdVar2 = &(vinfos.
                 super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->foffset;
      for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
        *pdVar2 = q_sols_00[lVar3];
        pdVar2 = pdVar2 + 3;
      }
      (*solutions->_vptr_IkSolutionListBase[2])(solutions,(allocator_type *)&vinfos,&vfree);
      std::
      _Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
      ::~_Vector_base((_Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                       *)&vinfos);
      q_sols_00 = q_sols_00 + 6;
    }
    uVar4 = (ulong)(0 < (int)local_26c);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&vfree.super__Vector_base<int,_std::allocator<int>_>);
  }
  return SUB81(uVar4,0);
}

Assistant:

IKFAST_API bool ComputeIk(const IkReal* eetrans, const IkReal* eerot, const IkReal* pfree, IkSolutionListBase<IkReal>& solutions) {
  if(!pfree) return false;

  int n = GetNumJoints();
  double q_sols[8*6];
  double T[16];

  to_mat44(T, eetrans, eerot);

  int num_sols = ur_kinematics::inverse(T, q_sols,pfree[0]);

  std::vector<int> vfree(0);

  for (int i=0; i < num_sols; ++i){
    std::vector<IkSingleDOFSolutionBase<IkReal> > vinfos(n);
    for (int j=0; j < n; ++j) vinfos[j].foffset = q_sols[i*n+j];
    solutions.AddSolution(vinfos,vfree);
  }
  return num_sols > 0;
}